

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_sub_complex.h
# Opt level: O0

optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle> * __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
::get_address(optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
              *__return_storage_ptr__,
             Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
             *this,Root_vertex_handle global)

{
  bool bVar1;
  reference ppVar2;
  _Self local_48 [3];
  _Self local_30;
  IdAddressMapConstIterator it;
  Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
  *this_local;
  optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle> *poStack_10;
  Root_vertex_handle global_local;
  optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle> *res;
  
  it._M_node._7_1_ = 0;
  this_local._4_4_ = global.vertex;
  poStack_10 = __return_storage_ptr__;
  boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::optional
            (__return_storage_ptr__);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>
       ::find(&this->addresses,(key_type *)((long)&this_local + 4));
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>
       ::end(&this->addresses);
  bVar1 = std::operator==(&local_30,local_48);
  if (bVar1) {
    boost::optional_detail::
    optional_base<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::reset
              (&__return_storage_ptr__->super_type);
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
             ::operator*(&local_30);
    boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
    operator=(__return_storage_ptr__,&ppVar2->second);
  }
  return __return_storage_ptr__;
}

Assistant:

boost::optional<Vertex_handle> get_address(Root_vertex_handle global) const {
    boost::optional < Vertex_handle > res;
    IdAddressMapConstIterator it = addresses.find(global);
    if (it == addresses.end())
      res.reset();
    else
      res = (*it).second;
    return res;
  }